

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_type.cpp
# Opt level: O0

spv_result_t spvtools::val::TypePass(ValidationState_t *_,Instruction *inst)

{
  Op OVar1;
  int32_t iVar2;
  spv_result_t sVar3;
  spv_result_t error_15;
  spv_result_t error_14;
  spv_result_t error_13;
  spv_result_t error_12;
  spv_result_t error_11;
  spv_result_t error_10;
  spv_result_t error_9;
  spv_result_t error_8;
  spv_result_t error_7;
  spv_result_t error_6;
  spv_result_t error_5;
  spv_result_t error_4;
  spv_result_t error_3;
  spv_result_t error_2;
  spv_result_t error_1;
  spv_result_t error;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  OVar1 = Instruction::opcode(inst);
  iVar2 = spvOpcodeGeneratesType(OVar1);
  if ((iVar2 == 0) && (OVar1 = Instruction::opcode(inst), OVar1 != OpTypeForwardPointer)) {
    return SPV_SUCCESS;
  }
  sVar3 = anon_unknown_2::ValidateUniqueness(_,inst);
  if (sVar3 != SPV_SUCCESS) {
    return sVar3;
  }
  OVar1 = Instruction::opcode(inst);
  if (OVar1 == OpTypeInt) {
    sVar3 = anon_unknown_2::ValidateTypeInt(_,inst);
  }
  else if (OVar1 == OpTypeFloat) {
    sVar3 = anon_unknown_2::ValidateTypeFloat(_,inst);
  }
  else if (OVar1 == OpTypeVector) {
    sVar3 = anon_unknown_2::ValidateTypeVector(_,inst);
  }
  else if (OVar1 == OpTypeMatrix) {
    sVar3 = anon_unknown_2::ValidateTypeMatrix(_,inst);
  }
  else if (OVar1 == OpTypeArray) {
    sVar3 = anon_unknown_2::ValidateTypeArray(_,inst);
  }
  else if (OVar1 == OpTypeRuntimeArray) {
    sVar3 = anon_unknown_2::ValidateTypeRuntimeArray(_,inst);
  }
  else if (OVar1 == OpTypeStruct) {
    sVar3 = anon_unknown_2::ValidateTypeStruct(_,inst);
  }
  else if (OVar1 == OpTypePointer) {
    sVar3 = anon_unknown_2::ValidateTypePointer(_,inst);
  }
  else if (OVar1 == OpTypeFunction) {
    sVar3 = anon_unknown_2::ValidateTypeFunction(_,inst);
  }
  else if (OVar1 == OpTypeForwardPointer) {
    sVar3 = anon_unknown_2::ValidateTypeForwardPointer(_,inst);
  }
  else if (OVar1 == OpTypeUntypedPointerKHR) {
    sVar3 = anon_unknown_2::ValidateTypeUntypedPointerKHR(_,inst);
  }
  else {
    if (OVar1 != OpTypeCooperativeMatrixKHR) {
      if (OVar1 == OpTypeCooperativeVectorNV) {
        sVar3 = anon_unknown_2::ValidateTypeCooperativeVectorNV(_,inst);
        goto joined_r0x00bd2d1e;
      }
      if (OVar1 != OpTypeCooperativeMatrixNV) {
        if (OVar1 == OpTypeTensorLayoutNV) {
          sVar3 = anon_unknown_2::ValidateTypeTensorLayoutNV(_,inst);
        }
        else {
          if (OVar1 != OpTypeTensorViewNV) {
            return SPV_SUCCESS;
          }
          sVar3 = anon_unknown_2::ValidateTypeTensorViewNV(_,inst);
        }
        goto joined_r0x00bd2d1e;
      }
    }
    sVar3 = anon_unknown_2::ValidateTypeCooperativeMatrix(_,inst);
  }
joined_r0x00bd2d1e:
  if (sVar3 == SPV_SUCCESS) {
    return SPV_SUCCESS;
  }
  return sVar3;
}

Assistant:

spv_result_t TypePass(ValidationState_t& _, const Instruction* inst) {
  if (!spvOpcodeGeneratesType(inst->opcode()) &&
      inst->opcode() != spv::Op::OpTypeForwardPointer) {
    return SPV_SUCCESS;
  }

  if (auto error = ValidateUniqueness(_, inst)) return error;

  switch (inst->opcode()) {
    case spv::Op::OpTypeInt:
      if (auto error = ValidateTypeInt(_, inst)) return error;
      break;
    case spv::Op::OpTypeFloat:
      if (auto error = ValidateTypeFloat(_, inst)) return error;
      break;
    case spv::Op::OpTypeVector:
      if (auto error = ValidateTypeVector(_, inst)) return error;
      break;
    case spv::Op::OpTypeMatrix:
      if (auto error = ValidateTypeMatrix(_, inst)) return error;
      break;
    case spv::Op::OpTypeArray:
      if (auto error = ValidateTypeArray(_, inst)) return error;
      break;
    case spv::Op::OpTypeRuntimeArray:
      if (auto error = ValidateTypeRuntimeArray(_, inst)) return error;
      break;
    case spv::Op::OpTypeStruct:
      if (auto error = ValidateTypeStruct(_, inst)) return error;
      break;
    case spv::Op::OpTypePointer:
      if (auto error = ValidateTypePointer(_, inst)) return error;
      break;
    case spv::Op::OpTypeFunction:
      if (auto error = ValidateTypeFunction(_, inst)) return error;
      break;
    case spv::Op::OpTypeForwardPointer:
      if (auto error = ValidateTypeForwardPointer(_, inst)) return error;
      break;
    case spv::Op::OpTypeCooperativeMatrixNV:
    case spv::Op::OpTypeCooperativeMatrixKHR:
      if (auto error = ValidateTypeCooperativeMatrix(_, inst)) return error;
      break;
    case spv::Op::OpTypeCooperativeVectorNV:
      if (auto error = ValidateTypeCooperativeVectorNV(_, inst)) return error;
      break;
    case spv::Op::OpTypeUntypedPointerKHR:
      if (auto error = ValidateTypeUntypedPointerKHR(_, inst)) return error;
      break;
    case spv::Op::OpTypeTensorLayoutNV:
      if (auto error = ValidateTypeTensorLayoutNV(_, inst)) return error;
      break;
    case spv::Op::OpTypeTensorViewNV:
      if (auto error = ValidateTypeTensorViewNV(_, inst)) return error;
      break;
    default:
      break;
  }

  return SPV_SUCCESS;
}